

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp128.hpp
# Opt level: O1

uint duckdb::Chimp128Decompression<unsigned_int>::DecompressValue
               (Flags flag,uint8_t *leading_zeros,uint32_t *leading_zero_index,
               UnpackedData *unpacked_data,uint32_t *unpacked_index,DecompressState *state)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint8_t *puVar6;
  byte bVar7;
  uint uVar8;
  InternalException *this;
  sbyte sVar9;
  uint64_t uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  undefined7 in_register_00000039;
  uint uVar14;
  byte bVar15;
  uint8_t uVar16;
  string local_50;
  
  uVar12 = CONCAT71(in_register_00000039,flag) & 0xffffffff;
  switch(uVar12) {
  case 0:
    uVar8 = (state->input).index;
    uVar14 = uVar8 & 7;
    puVar6 = (state->input).input;
    bVar7 = puVar6[uVar8 >> 3];
    bVar15 = BitReader::REMAINDER_MASKS[(ulong)uVar14 + 7];
    bVar1 = puVar6[((ulong)(uVar8 >> 3) + 1) - (ulong)((ulong)uVar14 == 0)];
    (state->input).index = uVar8 + 7;
    uVar8 = (uint)(state->ring_buffer).buffer
                  [(uint)(byte)((bVar15 & bVar1) >> (1U - (char)uVar8 & 7)) |
                   ((uint)bVar7 << (sbyte)uVar14) >> 1 & 0x7f];
    goto LAB_0170d6af;
  case 1:
    uVar8 = *unpacked_index;
    *unpacked_index = uVar8 + 1;
    uVar16 = unpacked_data[uVar8].leading_zero;
    state->leading_zeros = uVar16;
    bVar15 = 0x20 - (uVar16 + unpacked_data[uVar8].significant_bits);
    state->trailing_zeros = bVar15;
    bVar7 = unpacked_data[uVar8].significant_bits;
    uVar12 = (ulong)(bVar7 >> 3);
    uVar14 = 0;
    if (7 < bVar7) {
      puVar6 = (state->input).input;
      uVar5 = (state->input).index;
      uVar11 = 0;
      uVar14 = 0;
      do {
        uVar14 = uVar14 << 8 |
                 ((uint)CONCAT11(puVar6[uVar11 + (uVar5 >> 3)],
                                 puVar6[uVar11 + (ulong)(uVar5 >> 3) + 1] &
                                 BitReader::REMAINDER_MASKS[(ulong)(uVar5 & 7) + 8]) <<
                 ((byte)uVar5 & 7)) >> 8 & 0xff;
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
    }
    uVar13 = bVar7 & 7;
    sVar9 = (sbyte)uVar13;
    uVar5 = (state->input).index;
    puVar6 = (state->input).input;
    bVar1 = puVar6[uVar12 + (uVar5 >> 3)];
    bVar2 = BitReader::MASKS[uVar13];
    bVar3 = BitReader::REMAINDER_MASKS[(byte)(((byte)uVar5 & 7) + sVar9)];
    bVar4 = puVar6[(uVar12 + (uVar5 >> 3) + 1) - (ulong)((uVar5 & 7) + uVar13 < 8)];
    (state->input).index = bVar7 + uVar5;
    uVar8 = (((uint)bVar2 & (uint)bVar1 << (sbyte)(uVar5 & 7)) >> (8U - sVar9 & 0x1f) |
             uVar14 << sVar9 | (uint)(byte)((bVar3 & bVar4) >> (-(bVar7 + (byte)uVar5) & 7))) <<
            (bVar15 & 0x1f) ^ (uint)(state->ring_buffer).buffer[unpacked_data[uVar8].index];
    goto LAB_0170d6af;
  case 2:
    uVar16 = state->leading_zeros;
    bVar7 = 0x20 - uVar16;
    uVar8 = (uint)bVar7;
    uVar12 = (ulong)(bVar7 >> 3);
    uVar14 = 0;
    if (7 < bVar7) {
      puVar6 = (state->input).input;
      uVar5 = (state->input).index;
      uVar11 = 0;
      uVar14 = 0;
      do {
        uVar14 = uVar14 << 8 |
                 ((uint)CONCAT11(puVar6[uVar11 + (uVar5 >> 3)],
                                 puVar6[uVar11 + (ulong)(uVar5 >> 3) + 1] &
                                 BitReader::REMAINDER_MASKS[(ulong)(uVar5 & 7) + 8]) <<
                 ((byte)uVar5 & 7)) >> 8 & 0xff;
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
    }
    break;
  case 3:
    uVar8 = *leading_zero_index;
    *leading_zero_index = uVar8 + 1;
    uVar16 = leading_zeros[uVar8];
    state->leading_zeros = uVar16;
    bVar7 = 0x20 - uVar16;
    uVar8 = (uint)bVar7;
    uVar12 = (ulong)(bVar7 >> 3);
    uVar14 = 0;
    if (7 < bVar7) {
      puVar6 = (state->input).input;
      uVar5 = (state->input).index;
      uVar11 = 0;
      uVar14 = 0;
      do {
        uVar14 = uVar14 << 8 |
                 ((uint)CONCAT11(puVar6[uVar11 + (uVar5 >> 3)],
                                 puVar6[uVar11 + (ulong)(uVar5 >> 3) + 1] &
                                 BitReader::REMAINDER_MASKS[(ulong)(uVar5 & 7) + 8]) <<
                 ((byte)uVar5 & 7)) >> 8 & 0xff;
        uVar11 = uVar11 + 1;
      } while (uVar12 != uVar11);
    }
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Chimp compression flag with value %d not recognized","");
    InternalException::InternalException<duckdb::ChimpConstants::Flags>
              (this,&local_50,(Flags)uVar12);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar13 = uVar8 & 7;
  sVar9 = (sbyte)uVar13;
  uVar5 = (state->input).index;
  puVar6 = (state->input).input;
  bVar7 = puVar6[uVar12 + (uVar5 >> 3)];
  bVar15 = BitReader::MASKS[uVar13];
  bVar1 = BitReader::REMAINDER_MASKS[(byte)(((byte)uVar5 & 7) + sVar9)];
  bVar2 = puVar6[(uVar12 + (uVar5 >> 3) + 1) - (ulong)((uVar5 & 7) + uVar13 < 8)];
  (state->input).index = uVar5 + uVar8;
  uVar8 = (((uint)bVar15 & (uint)bVar7 << (sbyte)(uVar5 & 7)) >> (8U - sVar9 & 0x1f) |
           uVar14 << sVar9 | (uint)(byte)((bVar1 & bVar2) >> (uVar16 - (byte)uVar5 & 7))) ^
          state->reference_value;
LAB_0170d6af:
  state->reference_value = uVar8;
  uVar10 = (state->ring_buffer).index + 1;
  (state->ring_buffer).index = uVar10;
  (state->ring_buffer).buffer[(uint)uVar10 & 0x7f] = (ulong)uVar8;
  return uVar8;
}

Assistant:

static inline CHIMP_TYPE DecompressValue(ChimpConstants::Flags flag, uint8_t leading_zeros[],
	                                         uint32_t &leading_zero_index, UnpackedData unpacked_data[],
	                                         uint32_t &unpacked_index, DecompressState &state) {
		CHIMP_TYPE result;
		switch (flag) {
		case ChimpConstants::Flags::VALUE_IDENTICAL: {
			//! Value is identical to previous value
			auto index = state.input.template ReadValue<uint8_t, 7>();
			result = UnsafeNumericCast<CHIMP_TYPE>(state.ring_buffer.Value(index));
			break;
		}
		case ChimpConstants::Flags::TRAILING_EXCEEDS_THRESHOLD: {
			const UnpackedData &unpacked = unpacked_data[unpacked_index++];
			state.leading_zeros = unpacked.leading_zero;
			state.trailing_zeros = BIT_SIZE - unpacked.significant_bits - state.leading_zeros;
			result = state.input.template ReadValue<CHIMP_TYPE>(unpacked.significant_bits);
			result <<= state.trailing_zeros;
			result ^= state.ring_buffer.Value(unpacked.index);
			break;
		}
		case ChimpConstants::Flags::LEADING_ZERO_EQUALITY: {
			result = state.input.template ReadValue<CHIMP_TYPE>(BIT_SIZE - state.leading_zeros);
			result ^= state.reference_value;
			break;
		}
		case ChimpConstants::Flags::LEADING_ZERO_LOAD: {
			state.leading_zeros = leading_zeros[leading_zero_index++];
			D_ASSERT(state.leading_zeros <= BIT_SIZE);
			result = state.input.template ReadValue<CHIMP_TYPE>(BIT_SIZE - state.leading_zeros);
			result ^= state.reference_value;
			break;
		}
		default:
			throw InternalException("Chimp compression flag with value %d not recognized", flag);
		}
		state.reference_value = result;
		state.ring_buffer.InsertScan(result);
		return result;
	}